

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

Map * Map_Push_And_Get(Map *tree,void *str,size_t size,void *id)

{
  size_t sVar1;
  Map *pMVar2;
  
  if (size != 0) {
    sVar1 = 0;
    do {
      pMVar2 = tree->delta[*(byte *)((long)str + sVar1)];
      if (pMVar2 == (Map *)0x0) {
        if (size != sVar1) {
          pMVar2 = tree;
          if (sVar1 < size) {
            do {
              tree = (Map *)malloc(0x810);
              pMVar2->delta[*(byte *)((long)str + sVar1)] = tree;
              tree->is_final = '\0';
              memset(tree->delta,0,0x808);
              sVar1 = sVar1 + 1;
              pMVar2 = tree;
            } while (size != sVar1);
          }
          goto LAB_00143b94;
        }
        break;
      }
      sVar1 = sVar1 + 1;
      tree = pMVar2;
    } while (size != sVar1);
  }
  if (tree->ID != (void *)0x0) {
LAB_00143b94:
    tree->ID = id;
  }
  tree->is_final = '\x01';
  return tree;
}

Assistant:

struct Map* Map_Push_And_Get(struct Map* tree,void *str,size_t size,void *id)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);	

	if(temp == size)
	{
		if(tree->ID!=NULL)tree->ID=id;
		tree->is_final=1;
		return tree;
	}

	for(temp;temp<size;++temp)
	{
		Map_Init(
			tree=
			tree->delta[((unsigned char*)str)[temp]]=
			malloc(sizeof(Map))
			);
	}

	tree->ID=id;
	tree->is_final=1;
	return tree;
}